

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O0

bool P_CheckForGLNodes(void)

{
  uint uVar1;
  uint local_2c;
  int missing;
  DWORD j;
  seg_t *lastseg;
  seg_t *firstseg;
  subsector_t *sub;
  int i;
  
  sub._0_4_ = 0;
  while( true ) {
    if (numsubsectors <= (int)sub) {
      uVar1 = CheckForMissingSegs();
      if (0 < (int)uVar1) {
        Printf("%d missing segs counted\nThe BSP needs to be rebuilt.\n",(ulong)uVar1);
      }
      return uVar1 == 0;
    }
    if ((subsectors[(int)sub].firstline)->v1 !=
        subsectors[(int)sub].firstline[(ulong)subsectors[(int)sub].numlines - 1].v2) break;
    for (local_2c = 0; local_2c < subsectors[(int)sub].numlines; local_2c = local_2c + 1) {
      if (segs[local_2c].linedef == (line_t_conflict *)0x0) {
        return true;
      }
    }
    sub._0_4_ = (int)sub + 1;
  }
  return false;
}

Assistant:

bool P_CheckForGLNodes()
{
	int i;

	for(i=0;i<numsubsectors;i++)
	{
		subsector_t * sub = &subsectors[i];
		seg_t * firstseg = sub->firstline;
		seg_t * lastseg = sub->firstline + sub->numlines - 1;

		if (firstseg->v1 != lastseg->v2)
		{
			// This subsector is incomplete which means that these
			// are normal nodes
			return false;
		}
		else
		{
			for(DWORD j=0;j<sub->numlines;j++)
			{
				if (segs[j].linedef==NULL)	// miniseg
				{
					// We already have GL nodes. Great!
					return true;
				}
			}
		}
	}
	// all subsectors were closed but there are no minisegs
	// Although unlikely this can happen. Such nodes are not a problem.
	// all that is left is to check whether the BSP covers all sidedefs completely.
	int missing = CheckForMissingSegs();
	if (missing > 0)
	{
		Printf("%d missing segs counted\nThe BSP needs to be rebuilt.\n", missing);
	}
	return missing == 0;
}